

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O3

UniquePtr<SSL_SESSION> bssl::tls13_create_session_with_ticket(SSL *ssl,CBS *body)

{
  _Head_base<0UL,_ssl_session_st_*,_false> this;
  uint8_t *__src;
  size_t __n;
  bool bVar1;
  int iVar2;
  CBS *in_RDX;
  Array<unsigned_char> *this_00;
  undefined1 in_R8B;
  undefined1 in_R9B;
  ptrdiff_t _Num;
  initializer_list<bssl::SSLExtension_*> extensions_00;
  Span<const_unsigned_char> nonce;
  uint8_t alert;
  UniquePtr<SSL_SESSION> session;
  uint32_t server_timeout;
  CBS ticket;
  SSLFlags parsed;
  CBS ticket_nonce;
  SSLExtension early_data;
  SSLExtension flags;
  CBS extensions;
  undefined1 local_b1;
  _Head_base<0UL,_ssl_session_st_*,_false> local_b0;
  uint local_a4;
  CBS local_a0;
  undefined4 *local_90;
  undefined4 *local_88;
  CBS local_80;
  undefined4 local_70;
  CBS local_68;
  undefined4 local_58;
  CBS local_50;
  CBS local_40;
  
  SSL_SESSION_dup((bssl *)&local_b0,*(SSL_SESSION **)(body[3].data + 0x200),2);
  if (local_b0._M_head_impl == (SSL_SESSION *)0x0) goto LAB_00164a53;
  ssl_session_rebase_time((SSL *)body,local_b0._M_head_impl);
  iVar2 = CBS_get_u32(in_RDX,&local_a4);
  if (iVar2 == 0) {
LAB_00164a23:
    ssl_send_alert((SSL *)body,2,0x32);
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x498);
  }
  else {
    iVar2 = CBS_get_u32(in_RDX,&(local_b0._M_head_impl)->ticket_age_add);
    if (iVar2 == 0) goto LAB_00164a23;
    iVar2 = CBS_get_u8_length_prefixed(in_RDX,&local_80);
    if (iVar2 == 0) goto LAB_00164a23;
    iVar2 = CBS_get_u16_length_prefixed(in_RDX,&local_a0);
    __n = local_a0.len;
    __src = local_a0.data;
    if ((iVar2 == 0) || (local_a0.len == 0)) goto LAB_00164a23;
    this_00 = &(local_b0._M_head_impl)->ticket;
    bVar1 = Array<unsigned_char>::InitUninitialized(this_00,local_a0.len);
    if (!bVar1) goto LAB_00164a23;
    memmove(this_00->data_,__src,__n);
    iVar2 = CBS_get_u16_length_prefixed(in_RDX,&local_40);
    this._M_head_impl = local_b0._M_head_impl;
    if ((iVar2 == 0) || (in_RDX->len != 0)) goto LAB_00164a23;
    if (local_a4 < (local_b0._M_head_impl)->timeout) {
      (local_b0._M_head_impl)->timeout = local_a4;
    }
    iVar2 = SSL_is_dtls((SSL *)body);
    nonce.size_._0_1_ = iVar2 != 0;
    nonce.data_ = (uchar *)local_80.len;
    nonce.size_._1_7_ = 0;
    bVar1 = tls13_derive_session_psk
                      ((bssl *)this._M_head_impl,(SSL_SESSION *)local_80.data,nonce,(bool)in_R8B);
    if (bVar1) {
      local_90 = &local_70;
      local_70 = 0x1002a;
      local_68.data = (uint8_t *)0x0;
      local_68.len = 0;
      local_88 = &local_58;
      local_58 = 0x1003e;
      local_50.data = (uint8_t *)0x0;
      local_50.len = 0;
      local_b1 = 0x32;
      extensions_00._M_len = 1;
      extensions_00._M_array = (iterator)0x2;
      bVar1 = ssl_parse_extensions
                        ((bssl *)&local_40,(CBS *)&local_b1,(uint8_t *)&local_90,extensions_00,
                         (bool)in_R9B);
      if (bVar1) {
        if (local_70._3_1_ != '\x01') {
LAB_00164ba8:
          if (local_58._3_1_ == '\x01') {
            bVar1 = ssl_parse_flags_extension_request(&local_50,(SSLFlags *)&local_90,&local_b1);
            if (!bVar1) {
              ssl_send_alert((SSL *)body,2,(uint)local_b1);
              goto LAB_00164a53;
            }
            if (((ulong)local_90 & 0x100) != 0) {
              (local_b0._M_head_impl)->field_0x1b8 = (local_b0._M_head_impl)->field_0x1b8 | 0x80;
            }
          }
          ((local_b0._M_head_impl)->session_id).size_ = ' ';
          SHA256(local_a0.data,local_a0.len,(uchar *)&(local_b0._M_head_impl)->session_id);
          (local_b0._M_head_impl)->field_0x1b8 = (local_b0._M_head_impl)->field_0x1b8 & 0xf3 | 8;
          ssl->method = (SSL_PROTOCOL_METHOD *)local_b0._M_head_impl;
          local_b0._M_head_impl = (SSL_SESSION *)0x0;
          goto LAB_00164a5a;
        }
        iVar2 = CBS_get_u32(&local_68,&(local_b0._M_head_impl)->ticket_max_early_data);
        if ((iVar2 == 0) || (local_68.len != 0)) {
          ssl_send_alert((SSL *)body,2,0x32);
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,0x4b4);
        }
        else {
          iVar2 = SSL_is_quic((SSL *)body);
          if ((iVar2 == 0) || ((local_b0._M_head_impl)->ticket_max_early_data == 0xffffffff))
          goto LAB_00164ba8;
          ssl_send_alert((SSL *)body,2,0x2f);
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,0x4bc);
        }
      }
      else {
        ssl_send_alert((SSL *)body,2,(uint)local_b1);
      }
    }
  }
LAB_00164a53:
  ssl->method = (SSL_PROTOCOL_METHOD *)0x0;
LAB_00164a5a:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_b0);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)ssl;
}

Assistant:

UniquePtr<SSL_SESSION> tls13_create_session_with_ticket(SSL *ssl, CBS *body) {
  UniquePtr<SSL_SESSION> session = SSL_SESSION_dup(
      ssl->s3->established_session.get(), SSL_SESSION_INCLUDE_NONAUTH);
  if (!session) {
    return nullptr;
  }

  ssl_session_rebase_time(ssl, session.get());

  uint32_t server_timeout;
  CBS ticket_nonce, ticket, extensions;
  if (!CBS_get_u32(body, &server_timeout) ||
      !CBS_get_u32(body, &session->ticket_age_add) ||
      !CBS_get_u8_length_prefixed(body, &ticket_nonce) ||
      !CBS_get_u16_length_prefixed(body, &ticket) ||
      CBS_len(&ticket) == 0 ||  //
      !session->ticket.CopyFrom(ticket) ||
      !CBS_get_u16_length_prefixed(body, &extensions) ||  //
      CBS_len(body) != 0) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return nullptr;
  }

  // Cap the renewable lifetime by the server advertised value. This avoids
  // wasting bandwidth on 0-RTT when we know the server will reject it.
  if (session->timeout > server_timeout) {
    session->timeout = server_timeout;
  }

  if (!tls13_derive_session_psk(session.get(), ticket_nonce,
                                SSL_is_dtls(ssl))) {
    return nullptr;
  }

  SSLExtension early_data(TLSEXT_TYPE_early_data);
  SSLExtension flags(TLSEXT_TYPE_tls_flags);
  uint8_t alert = SSL_AD_DECODE_ERROR;
  if (!ssl_parse_extensions(&extensions, &alert, {&early_data, &flags},
                            /*ignore_unknown=*/true)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return nullptr;
  }

  if (early_data.present) {
    if (!CBS_get_u32(&early_data.data, &session->ticket_max_early_data) ||
        CBS_len(&early_data.data) != 0) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return nullptr;
    }

    // QUIC does not use the max_early_data_size parameter and always sets it to
    // a fixed value. See RFC 9001, section 4.6.1.
    if (SSL_is_quic(ssl) && session->ticket_max_early_data != 0xffffffff) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return nullptr;
    }
  }

  if (flags.present) {
    SSLFlags parsed;
    if (!ssl_parse_flags_extension_request(&flags.data, &parsed, &alert)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
      return nullptr;
    }
    if (parsed & kSSLFlagResumptionAcrossNames) {
      session->is_resumable_across_names = true;
    }
  }

  // Historically, OpenSSL filled in fake session IDs for ticket-based sessions.
  // Envoy's tests depend on this, although perhaps they shouldn't.
  session->session_id.ResizeForOverwrite(SHA256_DIGEST_LENGTH);
  SHA256(CBS_data(&ticket), CBS_len(&ticket), session->session_id.data());

  session->ticket_age_add_valid = true;
  session->not_resumable = false;

  return session;
}